

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

void compute_Perms_value_V5_clear(string *encryption_key,EncryptionData *data,uchar *k)

{
  bool bVar1;
  int iVar2;
  uchar local_2d;
  int local_2c;
  ulong uStack_28;
  int i;
  unsigned_long_long extended_perms;
  uchar *k_local;
  EncryptionData *data_local;
  string *encryption_key_local;
  
  iVar2 = QPDF::EncryptionData::getP(data);
  uStack_28 = (long)iVar2 | 0xffffffff00000000;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    k[local_2c] = (uchar)uStack_28;
    uStack_28 = uStack_28 >> 8;
  }
  bVar1 = QPDF::EncryptionData::getEncryptMetadata(data);
  local_2d = 'T';
  if (!bVar1) {
    local_2d = 'F';
  }
  k[8] = local_2d;
  k[9] = 'a';
  k[10] = 'd';
  k[0xb] = 'b';
  QUtil::initializeWithRandomBytes(k + 0xc,4);
  return;
}

Assistant:

void
compute_Perms_value_V5_clear(
    std::string const& encryption_key, QPDF::EncryptionData const& data, unsigned char k[16])
{
    // From algorithm 3.10 from the PDF 1.7 extension level 3
    unsigned long long extended_perms =
        0xffffffff00000000LL | static_cast<unsigned long long>(data.getP());
    for (int i = 0; i < 8; ++i) {
        k[i] = static_cast<unsigned char>(extended_perms & 0xff);
        extended_perms >>= 8;
    }
    k[8] = data.getEncryptMetadata() ? 'T' : 'F';
    k[9] = 'a';
    k[10] = 'd';
    k[11] = 'b';
    QUtil::initializeWithRandomBytes(k + 12, 4);
}